

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  uint16_t *__src;
  uint8_t uVar1;
  ushort uVar2;
  uint8_t *puVar3;
  shared_container_t *sc;
  ulong uVar4;
  array_container_t *ac;
  uint16_t *puVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  void **ppvVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  array_container_t *paVar19;
  int iVar20;
  ushort uVar21;
  int32_t iVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  roaring_bitmap_t *prVar26;
  uint uVar27;
  int iVar28;
  ushort uVar29;
  int iVar30;
  bool bVar31;
  uint8_t new_type;
  int32_t union_cardinality;
  uint8_t local_81;
  roaring_bitmap_t *local_80;
  ulong local_78;
  array_container_t *local_70;
  uint local_64;
  ulong local_60;
  uint32_t local_58;
  uint32_t local_54;
  ulong local_50;
  uint local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  if (min <= max) {
    uVar27 = min >> 0x10;
    local_64 = max >> 0x10;
    iVar30 = (r->high_low_container).size;
    if (iVar30 == 0) {
      uVar8 = 0;
      uVar18 = 0;
    }
    else {
      puVar5 = (r->high_low_container).keys;
      uVar18 = 0;
      uVar7 = 0;
      if (0 < iVar30) {
        iVar24 = iVar30 + -1;
        uVar8 = 0;
        do {
          uVar7 = iVar24 + uVar8 >> 1;
          uVar29 = *(ushort *)((long)puVar5 + (ulong)(iVar24 + uVar8 & 0xfffffffe));
          uVar21 = (ushort)(max >> 0x10);
          if (uVar29 < uVar21) {
            uVar8 = uVar7 + 1;
          }
          else {
            if (uVar29 <= uVar21) {
              uVar7 = ~uVar7;
              goto LAB_001021ae;
            }
            iVar24 = uVar7 - 1;
          }
        } while ((int)uVar8 <= iVar24);
        uVar7 = -uVar8;
        if ((int)uVar8 < 1) {
          uVar7 = uVar8;
        }
      }
LAB_001021ae:
      uVar8 = uVar7 + iVar30;
      if (uVar7 != 0) {
        uVar18 = 0xffffffff;
        if (0x80000000 < uVar7) {
          uVar7 = ~uVar7;
          uVar17 = 0;
          do {
            uVar18 = uVar7 + uVar17 >> 1;
            uVar29 = *(ushort *)((long)puVar5 + (ulong)(uVar7 + uVar17 & 0xfffffffe));
            uVar21 = (ushort)(min >> 0x10);
            if (uVar29 < uVar21) {
              uVar17 = uVar18 + 1;
            }
            else {
              if (uVar29 <= uVar21) goto LAB_001021ef;
              uVar7 = uVar18 - 1;
            }
          } while ((int)uVar17 <= (int)uVar7);
          uVar18 = ~uVar17;
        }
LAB_001021ef:
        uVar18 = (int)uVar18 >> 0x1f ^ uVar18;
      }
    }
    iVar30 = (iVar30 - uVar8) - uVar18;
    local_80 = r;
    local_58 = min;
    local_54 = max;
    if (iVar30 <= (int)(local_64 - uVar27)) {
      ra_shift_tail(&r->high_low_container,uVar8,((local_64 - uVar27) - iVar30) + 1);
    }
    if (local_64 != uVar27 - 1) {
      uVar18 = (uVar18 + iVar30) - 1;
      local_58 = local_58 & 0xffff;
      local_54 = local_54 & 0xffff;
      lVar16 = (long)(int)(~uVar8 + (local_80->high_low_container).size);
      prVar26 = local_80;
      uVar8 = local_64;
      local_38 = (ulong)uVar27;
      do {
        uVar27 = 0;
        if ((uint)local_38 == uVar8) {
          uVar27 = local_58;
        }
        uVar7 = 0xffff;
        if (local_64 == uVar8) {
          uVar7 = local_54;
        }
        if (((int)uVar18 < 0) ||
           (uVar9 = (ulong)uVar18, uVar8 != (prVar26->high_low_container).keys[uVar9])) {
          if ((uVar7 - uVar27) + 2 < 3) {
            local_81 = '\x02';
            ac = array_container_create_range(uVar27,uVar7 + 1);
            prVar26 = local_80;
          }
          else {
            local_81 = '\x03';
            ac = (array_container_t *)run_container_create_given_capacity(1);
            prVar26 = local_80;
            if (ac == (array_container_t *)0x0) {
              ac = (array_container_t *)0x0;
            }
            else {
              *(uint *)(ac->array + (long)ac->cardinality * 2) = (uVar7 - uVar27) * 0x10000 | uVar27
              ;
              ac->cardinality = ac->cardinality + 1;
            }
          }
        }
        else {
          ppvVar10 = (prVar26->high_low_container).containers;
          puVar3 = (prVar26->high_low_container).typecodes;
          uVar17 = uVar18 & 0xffff;
          sc = (shared_container_t *)ppvVar10[uVar17];
          local_78 = uVar9;
          local_44 = uVar18;
          if (puVar3[uVar17] == '\x04') {
            sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar17);
            ppvVar10 = (local_80->high_low_container).containers;
            prVar26 = local_80;
          }
          ppvVar10[uVar17] = sc;
          ac = (array_container_t *)(prVar26->high_low_container).containers[local_78];
          uVar1 = (prVar26->high_low_container).typecodes[local_78];
          uVar29 = (ushort)uVar7;
          uVar21 = (ushort)uVar27;
          if (uVar1 == '\x03') {
            puVar5 = ac->array;
            iVar30 = ac->cardinality;
            uVar18 = 0;
            iVar24 = 0;
            if (iVar30 != 0) {
              if (iVar30 < 1) {
                iVar24 = 0;
              }
              else {
                iVar20 = iVar30 + -1;
                iVar24 = 0;
                do {
                  uVar17 = (uint)(iVar20 + iVar24) >> 1;
                  if ((ushort)(puVar5[(ulong)uVar17 * 2 + 1] + puVar5[(ulong)uVar17 * 2]) < uVar29)
                  {
                    iVar24 = uVar17 + 1;
                  }
                  else {
                    if ((uint)puVar5[(ulong)uVar17 * 2] <= uVar7 + 1) {
                      iVar24 = ~uVar17 + iVar30;
                      goto LAB_00102723;
                    }
                    iVar20 = uVar17 - 1;
                  }
                } while (iVar24 <= iVar20);
              }
              iVar24 = iVar30 - iVar24;
            }
LAB_00102723:
            iVar20 = iVar30 - iVar24;
            if (iVar20 != 0 && iVar24 <= iVar30) {
              iVar28 = iVar20 + -1;
              uVar17 = 0;
              do {
                uVar18 = iVar28 + uVar17 >> 1;
                if ((ushort)(puVar5[(ulong)uVar18 * 2 + 1] + puVar5[(ulong)uVar18 * 2]) + 1 < uVar27
                   ) {
                  uVar18 = uVar18 + 1;
                }
                else {
                  if (puVar5[(ulong)uVar18 * 2] <= uVar21) break;
                  iVar28 = uVar18 - 1;
                  uVar18 = uVar17;
                }
                uVar17 = uVar18;
              } while ((int)uVar18 <= iVar28);
            }
            iVar28 = uVar18 + iVar24 + 1;
            if (iVar28 * 4 < 0x2001) {
              uVar9 = (ulong)uVar18;
              if (iVar30 == uVar18 + iVar24) {
                local_70 = ac;
                local_60 = uVar9;
                if (ac->capacity <= iVar30) {
                  run_container_grow((run_container_t *)ac,iVar30 + 1,true);
                  iVar30 = ac->cardinality;
                  puVar5 = ac->array;
                }
                uVar18 = uVar18 & 0xffff;
                memmove(puVar5 + (ulong)uVar18 * 2 + 2,puVar5 + (ulong)uVar18 * 2,
                        (long)(int)(iVar30 - uVar18) << 2);
                ac->cardinality = ac->cardinality + 1;
                puVar5 = ac->array;
                puVar5[local_60 * 2] = uVar21;
                puVar5[local_60 * 2 + 1] = uVar29 - uVar21;
              }
              else {
                __src = puVar5 + (long)iVar20 * 2;
                if (puVar5[uVar9 * 2] < uVar27) {
                  uVar27 = (uint)puVar5[uVar9 * 2];
                }
                uVar17 = (uint)__src[-1] + (uint)__src[-2];
                if ((uint)__src[-1] + (uint)__src[-2] <= uVar7) {
                  uVar17 = uVar7;
                }
                puVar5[uVar9 * 2] = (uint16_t)uVar27;
                puVar5[uVar9 * 2 + 1] = (short)uVar17 - (uint16_t)uVar27;
                local_70 = ac;
                memmove(puVar5 + (ulong)(uVar18 + 1) * 2,__src,(long)iVar24 << 2);
                local_70->cardinality = iVar28;
                ac = local_70;
              }
              local_81 = '\x03';
              prVar26 = local_80;
            }
            else {
              local_70 = ac;
              ac = (array_container_t *)
                   container_from_run_range((run_container_t *)ac,uVar27,uVar7,&local_81);
              prVar26 = local_80;
            }
          }
          else {
            bVar6 = (byte)uVar27;
            if (uVar1 == '\x02') {
              puVar5 = ac->array;
              iVar30 = ac->cardinality;
              uVar18 = 0;
              if (iVar30 == 0) {
                iVar24 = 0;
              }
              else {
                uVar18 = 0;
                iVar24 = iVar30;
                if (0 < iVar30) {
                  iVar24 = iVar30 + -1;
                  iVar20 = 0;
                  do {
                    uVar17 = (uint)(iVar24 + iVar20) >> 1;
                    uVar2 = *(ushort *)((long)puVar5 + (ulong)(iVar24 + iVar20 & 0xfffffffe));
                    if (uVar2 < uVar29) {
                      iVar20 = uVar17 + 1;
                    }
                    else {
                      if (uVar2 <= uVar29) {
                        uVar14 = ~uVar17;
                        iVar24 = iVar30 + uVar14;
                        uVar18 = 0xffffffff;
                        if (uVar17 == 0x7fffffff) goto LAB_00102710;
                        goto LAB_001026e4;
                      }
                      iVar24 = uVar17 - 1;
                    }
                  } while (iVar20 <= iVar24);
                  iVar28 = -iVar20;
                  if (0 < iVar20) {
                    iVar28 = iVar20;
                  }
                  iVar24 = iVar30 - iVar28;
                  if (iVar20 == 0) {
                    uVar18 = 0;
                  }
                  else {
                    uVar14 = -iVar28;
LAB_001026e4:
                    uVar14 = ~uVar14;
                    uVar17 = 0;
                    do {
                      uVar18 = uVar14 + uVar17 >> 1;
                      uVar29 = *(ushort *)((long)puVar5 + (ulong)(uVar14 + uVar17 & 0xfffffffe));
                      if (uVar29 < uVar21) {
                        uVar17 = uVar18 + 1;
                      }
                      else {
                        if (uVar29 <= uVar21) goto LAB_00102710;
                        uVar14 = uVar18 - 1;
                      }
                    } while ((int)uVar17 <= (int)uVar14);
                    uVar18 = ~uVar17;
LAB_00102710:
                    uVar18 = (int)uVar18 >> 0x1f ^ uVar18;
                  }
                }
              }
              uVar17 = uVar7 - uVar27;
              iVar20 = uVar17 + uVar18 + iVar24 + 1;
              if (iVar20 == 0x10000) goto LAB_00102893;
              local_60 = CONCAT44(local_60._4_4_,iVar20);
              if (iVar20 < 0x1001) {
                local_81 = '\x02';
                paVar19 = (array_container_t *)(ulong)uVar17;
                if (ac->capacity < iVar20) {
                  local_70 = (array_container_t *)(ulong)uVar17;
                  array_container_grow(ac,iVar20,true);
                  puVar5 = ac->array;
                  iVar30 = ac->cardinality;
                  paVar19 = local_70;
                }
                memmove(puVar5 + (int)((int)paVar19 + uVar18 + 1),puVar5 + (iVar30 - iVar24),
                        (long)iVar24 * 2);
                puVar5 = ac->array;
                lVar13 = ((ulong)paVar19 & 0xffffffff) + 1;
                do {
                  puVar5[uVar18] = (uint16_t)uVar27;
                  uVar18 = uVar18 + 1;
                  uVar27 = uVar27 + 1;
                  lVar13 = lVar13 + -1;
                } while (lVar13 != 0);
                ac->cardinality = (int32_t)local_60;
                prVar26 = local_80;
              }
              else {
                local_81 = '\x01';
                local_70 = (array_container_t *)bitset_container_from_array(ac);
                puVar5 = local_70->array;
                uVar27 = uVar27 >> 6;
                uVar18 = uVar7 >> 6;
                if (uVar18 - uVar27 == 0) {
                  *(ulong *)(puVar5 + (ulong)uVar27 * 4) =
                       *(ulong *)(puVar5 + (ulong)uVar27 * 4) |
                       (0xffffffffffffffffU >> (0x3fU - (char)uVar17 & 0x3f)) << (bVar6 & 0x3f);
                }
                else {
                  uVar9 = *(ulong *)(puVar5 + (ulong)uVar18 * 4);
                  *(ulong *)(puVar5 + (ulong)uVar27 * 4) =
                       *(ulong *)(puVar5 + (ulong)uVar27 * 4) | -1L << (bVar6 & 0x3f);
                  if (uVar27 + 1 < uVar18) {
                    memset(puVar5 + (ulong)uVar27 * 4 + 4,0xff,
                           (ulong)((uVar18 - uVar27) - 2 >> 1) * 0x10 + 0x10);
                  }
                  *(ulong *)(puVar5 + (ulong)uVar18 * 4) =
                       uVar9 | 0xffffffffffffffffU >> (~(byte)uVar7 & 0x3f);
                }
                local_70->cardinality = (int32_t)local_60;
                ac = local_70;
                prVar26 = local_80;
              }
            }
            else {
              iVar30 = (uVar7 - uVar27) + ac->cardinality + 1;
              puVar5 = ac->array;
              uVar18 = uVar27 >> 6;
              uVar4 = (ulong)uVar18;
              uVar17 = uVar7 >> 6;
              uVar9 = *(ulong *)(puVar5 + uVar4 * 4);
              if (uVar17 == uVar18) {
                uVar15 = (0xffffffffffffffffU >> (0x3fU - (char)(uVar7 - uVar27) & 0x3f)) <<
                         (bVar6 & 0x3f);
                uVar11 = uVar9 & uVar15;
                uVar11 = uVar11 - (uVar11 >> 1 & 0x5555555555555555);
                uVar11 = (uVar11 >> 2 & 0x3333333333333333) + (uVar11 & 0x3333333333333333);
                iVar22 = iVar30 - (uint)(byte)(((uVar11 >> 4) + uVar11 & 0xf0f0f0f0f0f0f0f) *
                                               0x101010101010101 >> 0x38);
                local_70 = ac;
                if (iVar22 != 0x10000) {
                  local_81 = '\x01';
                  *(ulong *)(puVar5 + uVar4 * 4) = uVar9 | uVar15;
LAB_001026b0:
                  local_70->cardinality = iVar22;
                  ac = local_70;
                  goto LAB_00102962;
                }
              }
              else {
                local_60 = CONCAT44(local_60._4_4_,iVar30);
                uVar15 = -1L << (bVar6 & 0x3f);
                uVar11 = uVar9 & uVar15;
                uVar11 = uVar11 - (uVar11 >> 1 & 0x5555555555555555);
                uVar11 = (uVar11 >> 2 & 0x3333333333333333) + (uVar11 & 0x3333333333333333);
                uVar11 = ((uVar11 >> 4) + uVar11 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
                uVar23 = uVar11 >> 0x38;
                uVar27 = (uint)(byte)(uVar11 >> 0x38);
                local_48 = uVar18 + 1;
                uVar11 = (ulong)uVar17;
                if (local_48 < uVar17) {
                  uVar12 = (ulong)local_48;
                  do {
                    uVar25 = *(ulong *)(puVar5 + uVar12 * 4) -
                             (*(ulong *)(puVar5 + uVar12 * 4) >> 1 & 0x5555555555555555);
                    uVar25 = (uVar25 >> 2 & 0x3333333333333333) + (uVar25 & 0x3333333333333333);
                    uVar27 = (int)uVar23 +
                             (uint)(byte)(((uVar25 >> 4) + uVar25 & 0xf0f0f0f0f0f0f0f) *
                                          0x101010101010101 >> 0x38);
                    uVar23 = (ulong)uVar27;
                    uVar12 = uVar12 + 1;
                    prVar26 = local_80;
                    local_40 = uVar9;
                  } while (uVar11 != uVar12);
                }
                local_50 = *(ulong *)(puVar5 + uVar11 * 4);
                uVar12 = 0xffffffffffffffff >> (~(byte)uVar7 & 0x3f);
                uVar23 = local_50 & uVar12;
                uVar23 = uVar23 - (uVar23 >> 1 & 0x5555555555555555);
                uVar23 = (uVar23 >> 2 & 0x3333333333333333) + (uVar23 & 0x3333333333333333);
                iVar22 = iVar30 - ((byte)(((uVar23 >> 4) + uVar23 & 0xf0f0f0f0f0f0f0f) *
                                          0x101010101010101 >> 0x38) + uVar27);
                local_70 = ac;
                if (iVar22 != 0x10000) {
                  local_81 = '\x01';
                  *(ulong *)(puVar5 + uVar4 * 4) = uVar9 | uVar15;
                  if (local_48 < uVar17) {
                    memset(puVar5 + uVar4 * 4 + 4,0xff,
                           (ulong)((uVar17 - uVar18) - 2 >> 1) * 0x10 + 0x10);
                    prVar26 = local_80;
                  }
                  *(ulong *)(puVar5 + uVar11 * 4) = local_50 | uVar12;
                  goto LAB_001026b0;
                }
              }
LAB_00102893:
              local_81 = '\x03';
              ac = (array_container_t *)run_container_create_given_capacity(1);
              prVar26 = local_80;
              if (ac == (array_container_t *)0x0) {
                ac = (array_container_t *)0x0;
              }
              else {
                puVar5 = ac->array;
                iVar30 = ac->cardinality;
                (puVar5 + (long)iVar30 * 2)[0] = 0;
                (puVar5 + (long)iVar30 * 2)[1] = 0xffff;
                ac->cardinality = ac->cardinality + 1;
              }
            }
          }
LAB_00102962:
          paVar19 = (array_container_t *)(prVar26->high_low_container).containers[local_78];
          if (ac != paVar19) {
            container_free(paVar19,(prVar26->high_low_container).typecodes[local_78]);
            prVar26 = local_80;
          }
          uVar18 = local_44 - 1;
        }
        (prVar26->high_low_container).keys[lVar16] = (uint16_t)uVar8;
        (prVar26->high_low_container).containers[lVar16] = ac;
        (prVar26->high_low_container).typecodes[lVar16] = local_81;
        lVar16 = lVar16 + -1;
        bVar31 = (uint)local_38 != uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar31);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r, uint32_t min,
                                     uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t num_required_containers = max_key - min_key + 1;
    int32_t suffix_length =
        count_greater(ra->keys, ra->size, (uint16_t)max_key);
    int32_t prefix_length =
        count_less(ra->keys, ra->size - suffix_length, (uint16_t)min_key);
    int32_t common_length = ra->size - prefix_length - suffix_length;

    if (num_required_containers > common_length) {
        ra_shift_tail(ra, suffix_length,
                      num_required_containers - common_length);
    }

    int32_t src = prefix_length + common_length - 1;
    int32_t dst = ra->size - suffix_length - 1;
    for (uint32_t key = max_key; key != min_key - 1;
         key--) {  // beware of min_key==0
        uint32_t container_min = (min_key == key) ? (min & 0xffff) : 0;
        uint32_t container_max = (max_key == key) ? (max & 0xffff) : 0xffff;
        container_t *new_container;
        uint8_t new_type;

        if (src >= 0 && ra->keys[src] == key) {
            ra_unshare_container_at_index(ra, (uint16_t)src);
            new_container =
                container_add_range(ra->containers[src], ra->typecodes[src],
                                    container_min, container_max, &new_type);
            if (new_container != ra->containers[src]) {
                container_free(ra->containers[src], ra->typecodes[src]);
            }
            src--;
        } else {
            new_container = container_from_range(&new_type, container_min,
                                                 container_max + 1, 1);
        }
        ra_replace_key_and_container_at_index(ra, dst, (uint16_t)key,
                                              new_container, new_type);
        dst--;
    }
}